

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O3

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<wchar_t>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          wchar_t *formula,size_t size,Options<wchar_t> *options)

{
  _Storage<wchar_t,_true> _Var1;
  wchar_t wVar2;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *pvVar3;
  Options<wchar_t> *options_00;
  pointer pTVar4;
  bool bVar5;
  int iVar6;
  wostream *pwVar7;
  size_t sVar8;
  _Elt_pointer pTVar9;
  runtime_error *prVar10;
  wchar_t *pwVar11;
  pointer pTVar12;
  pointer pTVar13;
  wchar_t wVar14;
  undefined **ppuVar15;
  wchar_t wVar16;
  wchar_t *pwVar17;
  pointer pTVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> sn_regex;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> sn_regex_ss;
  undefined1 local_2a8 [20];
  Subtype SStack_294;
  wchar_t *pwStack_290;
  wchar_t *local_288;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_280;
  pointer local_278;
  pointer local_270;
  undefined1 local_268 [32];
  _Elt_pointer local_248;
  _Map_pointer ppTStack_240;
  _Elt_pointer local_238;
  _Elt_pointer pTStack_230;
  _Elt_pointer local_228;
  _Map_pointer ppTStack_220;
  _Storage<wchar_t,_true> local_210;
  _Storage<wchar_t,_true> local_20c;
  _Storage<wchar_t,_true> local_208;
  wchar_t local_204;
  wchar_t local_200;
  _Storage<wchar_t,_true> local_1fc;
  Options<wchar_t> *local_1f8;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> local_1d8;
  wostream *local_1b8 [2];
  wostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_270 = (pointer)size;
  if ((size < 2) || (*formula != L'=')) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Invalid Excel formula","");
    std::runtime_error::runtime_error(prVar10,(string *)local_1b8);
    *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
    __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  wVar14 = L'{';
  if ((options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    wVar14 = (options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
             super__Optional_payload_base<wchar_t>._M_payload._M_value;
  }
  wVar16 = L'[';
  if ((options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    wVar16 = (options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
             super__Optional_payload_base<wchar_t>._M_payload._M_value;
  }
  bVar19 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged != false;
  _Var1 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
          super__Optional_payload_base<wchar_t>._M_payload;
  local_20c._M_value = L'}';
  if (bVar19) {
    local_20c = _Var1;
  }
  local_1fc._M_value = L']';
  if (bVar19) {
    local_1fc = _Var1;
  }
  local_210._M_value = L',';
  if ((options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_210 = (options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  local_208._M_value = L';';
  if ((options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_208 = (options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  wVar2 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
          super__Optional_payload_base<wchar_t>._M_payload._M_value;
  bVar19 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged;
  local_288 = formula;
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1b8);
  pwVar7 = std::operator<<(local_1a8,"^[1-9](\\");
  local_268._0_4_ = L'.';
  if (bVar19 != false) {
    local_268._0_4_ = wVar2;
  }
  pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,(wchar_t *)local_268,1);
  std::operator<<(pwVar7,"\\d+)?E[+-]\\d*$");
  std::__cxx11::wstringbuf::str();
  pwVar17 = local_288;
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_1d8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_268
             ,0x11);
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ * 4 + 4);
  }
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228 = (_Elt_pointer)0x0;
  ppTStack_220 = (_Map_pointer)0x0;
  local_238 = (_Elt_pointer)0x0;
  pTStack_230 = (_Elt_pointer)0x0;
  local_248 = (_Elt_pointer)0x0;
  ppTStack_240 = (_Map_pointer)0x0;
  local_268._16_8_ = (void *)0x0;
  local_268._24_8_ = 0;
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = 0;
  local_280 = __return_storage_ptr__;
  local_204 = wVar14;
  local_200 = wVar16;
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
  _M_initialize_map((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                    local_268,0);
  bVar19 = false;
  pTVar18 = (pointer)0x1;
  bVar21 = false;
  bVar20 = false;
  bVar5 = false;
  pTVar13 = (pointer)0x1;
  local_1f8 = options;
  do {
    pvVar3 = local_280;
    wVar14 = pwVar17[(long)pTVar18];
    pTVar12 = pTVar13;
    if (wVar14 == L'\0') break;
    pwVar11 = pwVar17 + (long)pTVar18;
    pwVar17 = local_288;
    if (bVar5) {
      if (wVar14 != L'\"') {
        bVar5 = true;
        goto LAB_00176211;
      }
      pTVar4 = (pointer)((long)&pTVar18->m_start + 2);
      if ((local_270 < pTVar4) || (bVar5 = true, pwVar11[1] != L'\"')) {
        stack0xfffffffffffffd68 = (pointer)0x300000001;
        local_2a8._0_8_ = pTVar13;
        local_2a8._8_8_ = pTVar18;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
        pTVar12 = (pointer)((long)&pTVar18->m_start + 1);
        bVar5 = false;
        pwVar17 = local_288;
        pTVar4 = pTVar12;
      }
    }
    else {
      if (bVar20) {
        bVar20 = wVar14 != L'\'';
        if (((!bVar20) && (pTVar4 = (pointer)((long)&pTVar18->m_start + 2), pTVar4 <= local_270)) &&
           (pwVar11[1] == L'\'')) {
          bVar20 = true;
          bVar5 = false;
          goto LAB_00176219;
        }
        bVar5 = false;
      }
      else {
        if (!bVar21) {
          if (bVar19) {
            pTVar12 = (pointer)((long)&pTVar18->m_start + 1);
            pwVar17 = local_288 + (long)pTVar13;
            ppuVar15 = &PTR_anon_var_dwarf_1e36a1_001b7888;
            pwVar11 = L"#NULL!";
            local_278 = pTVar13;
            do {
              sVar8 = wcslen(pwVar11);
              if ((sVar8 == (long)pTVar12 - (long)pTVar13) &&
                 (iVar6 = wcsncmp(pwVar11,pwVar17,(long)pTVar12 - (long)pTVar13), iVar6 == 0)) {
                local_2a8._0_8_ = local_278;
                stack0xfffffffffffffd68 = (pointer)0x600000001;
                local_2a8._8_8_ = pTVar18;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                bVar5 = false;
                bVar20 = false;
                bVar21 = false;
                bVar19 = false;
                pwVar17 = local_288;
                pTVar4 = pTVar12;
                goto LAB_00176219;
              }
              pwVar11 = (wchar_t *)*ppuVar15;
              ppuVar15 = ppuVar15 + 1;
            } while (pwVar11 != (wchar_t *)0x0);
            bVar19 = true;
LAB_0017630c:
            bVar20 = false;
            bVar21 = false;
            bVar5 = false;
            pwVar17 = local_288;
            pTVar12 = local_278;
            pTVar4 = (pointer)((long)&pTVar18->m_start + 1);
            goto LAB_00176219;
          }
          if (pTVar13 < pTVar18) {
            stack0xfffffffffffffd68 = (pointer)0x0;
            pwStack_290 = (wchar_t *)0x0;
            local_2a8._0_8_ = (pointer)0x0;
            local_2a8._8_8_ = (pointer)0x0;
            local_278 = pTVar13;
            bVar19 = std::__detail::
                     __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,true>
                               (local_288 + (long)pTVar13,pwVar11 + 1,
                                (match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                                 *)local_2a8,&local_1d8,0);
            if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2a8._0_8_,
                              (long)stack0xfffffffffffffd68 - local_2a8._0_8_);
            }
            if (bVar19) {
              bVar19 = false;
              goto LAB_0017630c;
            }
            wVar14 = *pwVar11;
            pTVar13 = local_278;
          }
          if (wVar14 == L'\'') {
            if (pTVar13 < pTVar18) {
              local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
              stack0xfffffffffffffd68 = (pointer)0x0;
              local_2a8._0_8_ = pTVar13;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
              pTVar13 = pTVar18;
            }
            bVar20 = true;
            bVar5 = false;
LAB_0017641b:
            bVar19 = false;
          }
          else {
            if (wVar14 == L'\"') {
              if (pTVar13 < pTVar18) {
                local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                stack0xfffffffffffffd68 = (pointer)0x0;
                local_2a8._0_8_ = pTVar13;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                pTVar13 = pTVar18;
              }
              bVar5 = true;
LAB_00176409:
              bVar20 = false;
              goto LAB_0017641b;
            }
            if (wVar14 == local_200) {
              bVar21 = true;
              bVar5 = false;
              bVar20 = false;
              bVar19 = false;
              goto LAB_00176211;
            }
            if (wVar14 != L'#') {
              if (wVar14 == local_204) {
                if (pTVar13 < pTVar18) {
                  local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                  stack0xfffffffffffffd68 = (pointer)0x0;
                  local_2a8._0_8_ = pTVar13;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                  pTVar13 = pTVar18;
                }
                pwVar17 = local_288;
                stack0xfffffffffffffd68 = (pointer)0x100000003;
                local_2a8._0_8_ = pTVar13;
                local_2a8._8_8_ = pTVar18;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                stack0xfffffffffffffd68 = (pointer)0x100000004;
                local_2a8._0_8_ = pTVar13;
                local_2a8._8_8_ = pTVar18;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                local_2a8._0_4_ = 3;
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                emplace_back<xlfparser::Token::Type>
                          ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *
                           )local_268,(Type *)local_2a8);
                local_2a8._0_4_ = 4;
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                emplace_back<xlfparser::Token::Type>
                          ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *
                           )local_268,(Type *)local_2a8);
              }
              else {
                if ((wVar14 == local_208._M_value) && (local_238 != (_Elt_pointer)local_268._16_8_))
                {
                  pTVar9 = local_238;
                  if (local_238 == pTStack_230) {
                    pTVar9 = ppTStack_220[-1] + 0x80;
                  }
                  if (pTVar9[-1] == ArrayRow) {
                    if (pTVar13 < pTVar18) {
                      local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      local_2a8._0_8_ = pTVar13;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                      pTVar13 = pTVar18;
                    }
                    pwVar17 = local_288;
                    pTVar9 = local_238;
                    if (local_238 == pTStack_230) {
                      pTVar9 = ppTStack_220[-1] + 0x80;
                    }
                    stack0xfffffffffffffd68 = (pointer)CONCAT44(Stop,pTVar9[-1]);
                    local_2a8._0_8_ = pTVar13;
                    local_2a8._8_8_ = pTVar18;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                    if (local_238 == pTStack_230) {
                      operator_delete(pTStack_230,0x200);
                      pTStack_230 = ppTStack_220[-1];
                      local_228 = pTStack_230 + 0x80;
                      local_238 = pTStack_230 + 0x7f;
                      ppTStack_220 = ppTStack_220 + -1;
                    }
                    else {
                      local_238 = local_238 + -1;
                    }
                    stack0xfffffffffffffd68 = (pointer)0x100000004;
                    local_2a8._0_8_ = pTVar13;
                    local_2a8._8_8_ = pTVar18;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                    local_2a8._0_4_ = 4;
                    std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                    emplace_back<xlfparser::Token::Type>
                              ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                *)local_268,(Type *)local_2a8);
                    goto LAB_00176a52;
                  }
                }
                if (wVar14 == local_20c._M_value) {
                  if (pTVar13 < pTVar18) {
                    local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                    stack0xfffffffffffffd68 = (pointer)0x1;
                    local_2a8._0_8_ = pTVar13;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                    pTVar13 = pTVar18;
                  }
                  pwVar17 = local_288;
                  if (local_238 == (_Elt_pointer)local_268._16_8_) {
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_2a8._0_8_ = local_2a8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2a8,"Mismatched braces","");
                    std::runtime_error::runtime_error(prVar10,(string *)local_2a8);
                    *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
                    __cxa_throw(prVar10,&invalid_formula::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pTVar9 = local_238;
                  if (local_238 == pTStack_230) {
                    pTVar9 = ppTStack_220[-1] + 0x80;
                  }
                  stack0xfffffffffffffd68 = (pointer)CONCAT44(Stop,pTVar9[-1]);
                  local_2a8._0_8_ = pTVar13;
                  local_2a8._8_8_ = pTVar18;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                  if (local_238 == pTStack_230) {
                    operator_delete(pTStack_230,0x200);
                    pTStack_230 = ppTStack_220[-1];
                    local_228 = pTStack_230 + 0x80;
                    pTVar9 = pTStack_230 + 0x7f;
                    local_238 = pTVar9;
                    ppTStack_220 = ppTStack_220 + -1;
                  }
                  else {
                    local_238 = local_238 + -1;
                    pTVar9 = local_238;
                    if (local_238 == pTStack_230) {
                      pTVar9 = ppTStack_220[-1] + 0x80;
                    }
                  }
                  stack0xfffffffffffffd68 = (pointer)CONCAT44(2,pTVar9[-1]);
                  local_2a8._0_8_ = pTVar13;
                  local_2a8._8_8_ = pTVar18;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
LAB_0017685e:
                  if (local_238 == pTStack_230) {
                    operator_delete(pTStack_230,0x200);
                    pTStack_230 = ppTStack_220[-1];
                    local_228 = pTStack_230 + 0x80;
                    local_238 = pTStack_230 + 0x7f;
                    ppTStack_220 = ppTStack_220 + -1;
                  }
                  else {
                    local_238 = local_238 + -1;
                  }
                }
                else {
                  if (wVar14 == L' ') {
                    pwVar17 = local_288;
                    if (pTVar13 < pTVar18) {
                      local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      local_2a8._0_8_ = pTVar13;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                      pwVar17 = local_288;
                      pTVar13 = pTVar18;
                    }
                    do {
                      pTVar12 = pTVar18;
                      if (local_270 <= pTVar12) break;
                      pTVar18 = (pointer)((long)&pTVar12->m_start + 1);
                    } while (pwVar17[(long)pTVar12] == L' ');
                    local_2a8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                    stack0xfffffffffffffd68 = (pointer)0xa;
                    local_2a8._0_8_ = pTVar13;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
LAB_00176907:
                    bVar5 = false;
                    bVar20 = false;
                    bVar21 = false;
                    bVar19 = false;
                    pTVar4 = pTVar12;
                    goto LAB_00176219;
                  }
                  pTVar12 = (pointer)((long)&pTVar18->m_start + 2);
                  local_278 = pTVar13;
                  if (pTVar12 <= local_270) {
                    ppuVar15 = &PTR_anon_var_dwarf_1e3731_001b78d8;
                    pwVar17 = L">=";
                    do {
                      sVar8 = wcslen(pwVar17);
                      if ((sVar8 == 2) &&
                         (iVar6 = wcsncmp(pwVar17,pwVar11,2), pvVar3 = local_280, iVar6 == 0)) {
                        local_2a8._0_8_ = local_278;
                        if (local_278 < pTVar18) {
                          local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                          stack0xfffffffffffffd68 = (pointer)0x1;
                          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                          emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                          local_2a8._0_8_ = pTVar18;
                        }
                        pwVar17 = local_288;
                        local_2a8._8_8_ = (long)&pTVar18->m_start + 1;
                        stack0xfffffffffffffd68 = (pointer)0x500000008;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                        goto LAB_00176907;
                      }
                      pwVar17 = (wchar_t *)*ppuVar15;
                      ppuVar15 = ppuVar15 + 1;
                    } while (pwVar17 != (wchar_t *)0x0);
                  }
                  pvVar3 = local_280;
                  pwVar17 = local_288;
                  wVar16 = L'+';
                  pwVar11 = L"+-*/^&=><@";
                  do {
                    pwVar11 = pwVar11 + 1;
                    if (wVar16 == wVar14) {
                      local_2a8._0_8_ = local_278;
                      if (local_278 < pTVar18) {
                        local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                        stack0xfffffffffffffd68 = (pointer)0x1;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                        local_2a8._0_8_ = pTVar18;
                      }
                      stack0xfffffffffffffd68 = (pointer)0x8;
                      local_2a8._8_8_ = pTVar18;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                      goto LAB_00176a52;
                    }
                    wVar16 = *pwVar11;
                  } while (wVar16 != L'\0');
                  if (wVar14 == L'%') {
                    local_2a8._0_8_ = local_278;
                    if (local_278 < pTVar18) {
                      local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_8_ = pTVar18;
                    }
                    stack0xfffffffffffffd68 = (pointer)0x9;
                    local_2a8._8_8_ = pTVar18;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                  }
                  else if (wVar14 == L'(') {
                    if (local_278 < pTVar18) {
                      local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                      local_2a8._0_8_ = local_278;
                      stack0xfffffffffffffd68 = (pointer)0x100000002;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_4_ = 2;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>
                                ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                  *)local_268,(Type *)local_2a8);
                    }
                    else {
                      local_2a8._0_8_ = local_278;
                      stack0xfffffffffffffd68 = (pointer)0x100000005;
                      local_2a8._8_8_ = pTVar18;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_4_ = 5;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>
                                ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                  *)local_268,(Type *)local_2a8);
                    }
                  }
                  else {
                    if (wVar14 != local_210._M_value) {
                      if (wVar14 != L')') {
                        bVar5 = false;
                        pTVar13 = local_278;
                        goto LAB_00176409;
                      }
                      pTVar13 = local_278;
                      if (local_278 < pTVar18) {
                        local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                        local_2a8._0_8_ = local_278;
                        stack0xfffffffffffffd68 = (pointer)0x1;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                        pTVar13 = pTVar18;
                      }
                      if (local_238 == (_Elt_pointer)local_268._16_8_) {
                        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                        local_2a8._0_8_ = local_2a8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2a8,"Mismatched parentheses","");
                        std::runtime_error::runtime_error(prVar10,(string *)local_2a8);
                        *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
                        __cxa_throw(prVar10,&invalid_formula::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      pTVar9 = local_238;
                      if (local_238 == pTStack_230) {
                        pTVar9 = ppTStack_220[-1] + 0x80;
                      }
                      stack0xfffffffffffffd68 = (pointer)CONCAT44(2,pTVar9[-1]);
                      local_2a8._0_8_ = pTVar13;
                      local_2a8._8_8_ = pTVar18;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                      goto LAB_0017685e;
                    }
                    local_2a8._0_8_ = local_278;
                    if (local_278 < pTVar18) {
                      local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_8_ = pTVar18;
                    }
                    if (local_238 == (_Elt_pointer)local_268._16_8_) {
LAB_00176b76:
                      uVar22 = 8;
                      uVar23 = 0xb;
                    }
                    else {
                      pTVar9 = local_238;
                      if (local_238 == pTStack_230) {
                        pTVar9 = ppTStack_220[-1] + 0x80;
                      }
                      uVar22 = 6;
                      uVar23 = 0;
                      if (pTVar9[-1] != Function) goto LAB_00176b76;
                    }
                    unique0x10000291 = (pointer)CONCAT44(uVar23,uVar22);
                    local_2a8._8_8_ = pTVar18;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
                  }
                }
              }
LAB_00176a52:
              pTVar12 = (pointer)((long)&pTVar18->m_start + 1);
              bVar5 = false;
              bVar20 = false;
              bVar21 = false;
              bVar19 = false;
              pTVar4 = pTVar12;
              goto LAB_00176219;
            }
            if (pTVar13 < pTVar18) {
              local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
              stack0xfffffffffffffd68 = (pointer)0x0;
              local_2a8._0_8_ = pTVar13;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(pvVar3,(Token *)local_2a8);
              pTVar13 = pTVar18;
            }
            bVar19 = true;
            bVar5 = false;
            bVar20 = false;
          }
          bVar21 = false;
          pwVar17 = local_288;
          pTVar12 = pTVar13;
          pTVar4 = (pointer)((long)&pTVar18->m_start + 1);
          goto LAB_00176219;
        }
        bVar21 = wVar14 != local_1fc._M_value;
        bVar5 = false;
        bVar20 = false;
      }
LAB_00176211:
      pwVar17 = local_288;
      pTVar12 = pTVar13;
      pTVar4 = (pointer)((long)&pTVar18->m_start + 1);
    }
LAB_00176219:
    pTVar18 = pTVar4;
    pTVar13 = pTVar12;
  } while (pTVar18 < local_270);
  pvVar3 = local_280;
  if ((pTVar12 < pTVar18) &&
     ((pTVar13 = (local_280->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
      (local_280->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
      super__Vector_impl_data._M_start == pTVar13 || ((pointer)pTVar13[-1].m_end < pTVar12)))) {
    local_2a8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
    stack0xfffffffffffffd68 = (pointer)0x1;
    local_2a8._0_8_ = pTVar12;
    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
              (local_280,(Token *)local_2a8);
  }
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector(&local_1f0,pvVar3);
  _fix_whitespace_tokens<wchar_t>
            ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)local_2a8,&local_1f0,
             pwVar17,(size_t)local_270);
  options_00 = local_1f8;
  pTVar13 = (pvVar3->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar18 = (pvVar3->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar3->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2a8._0_8_;
  (pvVar3->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2a8._8_8_;
  (pvVar3->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = stack0xfffffffffffffd68;
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  stack0xfffffffffffffd68 = (pointer)0x0;
  if ((pTVar13 != (pointer)0x0) &&
     (operator_delete(pTVar13,(long)pTVar18 - (long)pTVar13),
     (pointer)local_2a8._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_2a8._0_8_,(long)stack0xfffffffffffffd68 - local_2a8._0_8_);
  }
  if (local_1f0.super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _infer_token_subtypes<wchar_t>(pvVar3,options_00,pwVar17,(size_t)local_270);
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::~_Deque_base
            ((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
             local_268);
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_1d8)
  ;
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return pvVar3;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }